

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O2

void __thiscall
Lib::
DHMap<unsigned_int,_Lib::Stack<std::pair<Kernel::SymbolType,_unsigned_int>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
::expand(DHMap<unsigned_int,_Lib::Stack<std::pair<Kernel::SymbolType,_unsigned_int>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
         *this)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Entry *__ptr;
  Entry *pEVar6;
  void *placement;
  Entry *pEVar7;
  Exception *this_00;
  Stack<std::pair<Kernel::SymbolType,_unsigned_int>_> *s;
  Stack<std::pair<Kernel::SymbolType,_unsigned_int>_> local_50;
  
  if ((long)this->_capacityIndex < 0x1d) {
    iVar1 = *(int *)(DHMapTableCapacities + (long)this->_capacityIndex * 4 + 4);
    placement = Lib::alloc((long)iVar1 * 0x28);
    __ptr = this->_entries;
    pEVar6 = this->_afterLast;
    uVar2 = this->_timestamp;
    iVar3 = this->_capacity;
    this->_timestamp = 1;
    this->_size = 0;
    this->_deleted = 0;
    iVar4 = this->_capacityIndex;
    this->_capacityIndex = iVar4 + 1;
    this->_capacity = iVar1;
    this->_nextExpansionOccupancy = *(int *)(DHMapTableNextExpansions + (long)iVar4 * 4 + 4);
    pEVar7 = array_new<Lib::DHMap<unsigned_int,Lib::Stack<std::pair<Kernel::SymbolType,unsigned_int>>,Lib::DefaultHash,Lib::DefaultHash2>::Entry>
                       (placement,(long)iVar1);
    this->_entries = pEVar7;
    this->_afterLast = pEVar7 + this->_capacity;
    pEVar7 = __ptr;
    while (s = &pEVar7->_val, (Entry *)((long)(s + -1) + 0x18) != pEVar6) {
      uVar5 = *(uint *)((long)(s + -1) + 0x18);
      if ((uVar5 & 1) == 0 && uVar5 >> 2 == uVar2) {
        uVar5 = *(uint *)((long)(s + -1) + 0x1c);
        Stack<std::pair<Kernel::SymbolType,_unsigned_int>_>::Stack(&local_50,s);
        insert(this,uVar5,&local_50);
        Stack<std::pair<Kernel::SymbolType,_unsigned_int>_>::~Stack(&local_50);
      }
      Stack<std::pair<Kernel::SymbolType,_unsigned_int>_>::~Stack(s);
      pEVar7 = (Entry *)(s + 1);
    }
    if (iVar3 != 0) {
      Lib::free(__ptr);
    }
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x28);
  Lib::Exception::Exception(this_00,"Lib::DHMap::expand: MaxCapacityIndex reached.");
  __cxa_throw(this_00,&Lib::Exception::typeinfo,Lib::Exception::~Exception);
}

Assistant:

void expand()
  {
    if(_capacityIndex>=DHMAP_MAX_CAPACITY_INDEX) {
      throw Exception("Lib::DHMap::expand: MaxCapacityIndex reached.");
    }

    int newCapacity=DHMapTableCapacities[_capacityIndex+1];
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(Entry),"DHMap::Entry");


    Entry* oldEntries=_entries;
    Entry* oldAfterLast=_afterLast;
    unsigned oldTimestamp=_timestamp;
    int oldCapacity=_capacity;

    _timestamp=1;
    _size=0;
    _deleted=0;
    _capacityIndex++;
    _capacity = newCapacity;
    _nextExpansionOccupancy = DHMapTableNextExpansions[_capacityIndex];

    _entries = array_new<Entry>(mem, _capacity);
    _afterLast = _entries + _capacity;

    Entry* ep=oldEntries;
    while(ep!=oldAfterLast) {
      ASS(ep);
      if(ep->_info.timestamp==oldTimestamp && !ep->_info.deleted) {
	insert(std::move(ep->_key), std::move(ep->_val));
      }
      (ep++)->~Entry();
    }
    if(oldCapacity) {
      DEALLOC_KNOWN(oldEntries,oldCapacity*sizeof(Entry),"DHMap::Entry");
    }
  }